

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void * AllocUnitsRare(CPpmd7 *p,uint indx)

{
  Byte *pBVar1;
  uint uVar2;
  uint in_ESI;
  CPpmd7 *in_RDI;
  CPpmd7 *in_stack_00000010;
  UInt32 numBytes;
  void *retVal;
  uint i;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint local_18;
  CPpmd7 *local_8;
  
  local_18 = in_ESI;
  if ((in_RDI->GlueCount == 0) && (GlueFreeBlocks(in_stack_00000010), in_RDI->FreeList[in_ESI] != 0)
     ) {
    local_8 = (CPpmd7 *)RemoveNode(in_RDI,in_ESI);
  }
  else {
    do {
      local_18 = local_18 + 1;
      if (local_18 == 0x26) {
        uVar2 = (uint)in_RDI->Indx2Units[in_ESI] * 0xc;
        in_RDI->GlueCount = in_RDI->GlueCount - 1;
        if (uVar2 < (uint)((int)in_RDI->UnitsStart - (int)in_RDI->Text)) {
          pBVar1 = in_RDI->UnitsStart;
          in_RDI->UnitsStart = pBVar1 + -(ulong)uVar2;
          return pBVar1 + -(ulong)uVar2;
        }
        return (void *)0x0;
      }
    } while (in_RDI->FreeList[local_18] == 0);
    local_8 = (CPpmd7 *)RemoveNode(in_RDI,local_18);
    SplitBlock(local_8,(void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(uint)in_stack_ffffffffffffffd0);
  }
  return local_8;
}

Assistant:

static void *AllocUnitsRare(CPpmd7 *p, unsigned indx)
{
  unsigned i;
  void *retVal;
  if (p->GlueCount == 0)
  {
    GlueFreeBlocks(p);
    if (p->FreeList[indx] != 0)
      return RemoveNode(p, indx);
  }
  i = indx;
  do
  {
    if (++i == PPMD_NUM_INDEXES)
    {
      UInt32 numBytes = U2B(I2U(indx));
      p->GlueCount--;
      return ((UInt32)(p->UnitsStart - p->Text) > numBytes) ? (p->UnitsStart -= numBytes) : (NULL);
    }
  }
  while (p->FreeList[i] == 0);
  retVal = RemoveNode(p, i);
  SplitBlock(p, retVal, i, indx);
  return retVal;
}